

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# road_network.cpp
# Opt level: O3

vector<node_type,_std::allocator<node_type>_> * __thiscall
road_network::get_predecessors
          (vector<node_type,_std::allocator<node_type>_> *__return_storage_ptr__,road_network *this,
          node_type node)

{
  long *plVar1;
  pointer psVar2;
  iterator __position;
  undefined8 in_RAX;
  undefined7 in_register_00000011;
  ulong uVar3;
  long *plVar4;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<node_type,_std::allocator<node_type>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<node_type,_std::allocator<node_type>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<node_type,_std::allocator<node_type>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar2 = (this->_g).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (ulong)(uint)((int)CONCAT71(in_register_00000011,node) << 5);
  plVar1 = (long *)((long)&(psVar2->super_StoredVertex).m_out_edges.
                           super__List_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
                   + uVar3);
  plVar4 = *(long **)((long)&(psVar2->super_StoredVertex).m_out_edges.
                             super__List_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
                     + uVar3);
  if (plVar4 != plVar1) {
    uStack_28 = in_RAX;
    do {
      uStack_28 = CONCAT17(*(node_type *)(plVar4 + 2),(undefined7)uStack_28);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<node_type,_std::allocator<node_type>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<node_type,_std::allocator<node_type>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<node_type,_std::allocator<node_type>_>::_M_realloc_insert<node_type>
                  (__return_storage_ptr__,__position,(node_type *)((long)&uStack_28 + 7));
      }
      else {
        *__position._M_current = *(node_type *)(plVar4 + 2);
        (__return_storage_ptr__->super__Vector_base<node_type,_std::allocator<node_type>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      plVar4 = (long *)*plVar4;
    } while (plVar4 != plVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<node_type> road_network::get_predecessors(node_type node)
{
    std::vector<node_type> pre;
    graph::vertex_descriptor start = boost::vertex(node, _g);

    for (auto vd : boost::make_iterator_range(boost::adjacent_vertices(start, _g))) 
    {
        pre.push_back(static_cast<node_type>(vd));
    }
    return pre;
}